

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::less<double>>
               (undefined8 param_1,undefined8 param_2)

{
  double dVar1;
  bool bVar2;
  reference pdVar3;
  reference __y;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *this;
  difference_type dVar4;
  T tmp;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> sift_1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> sift;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> cur;
  size_t limit;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff88;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_50;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *local_48;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_38;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_30;
  ulong local_28;
  less<double> local_19;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  bVar2 = __gnu_cxx::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (!bVar2) {
    local_28 = 0;
    local_30 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                           (difference_type)in_stack_ffffffffffffff90);
    while (bVar2 = __gnu_cxx::operator!=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88), bVar2
          ) {
      local_38._M_current = local_30._M_current;
      local_40 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator-((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                           (difference_type)in_stack_ffffffffffffff90);
      pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_38);
      __y = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
            operator*(&local_40);
      bVar2 = std::less<double>::operator()(&local_19,pdVar3,__y);
      if (bVar2) {
        pdVar3 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_38);
        local_48 = (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                   *pdVar3;
        do {
          pdVar3 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator*(&local_40);
          dVar1 = *pdVar3;
          local_50 = __gnu_cxx::
                     __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                     operator--((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                                (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
          pdVar3 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator*(&local_50);
          *pdVar3 = dVar1;
          bVar2 = __gnu_cxx::operator!=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          in_stack_ffffffffffffff9f = false;
          if (bVar2) {
            this = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator--(&local_40);
            pdVar3 = __gnu_cxx::
                     __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                     operator*(this);
            in_stack_ffffffffffffff9f =
                 std::less<double>::operator()(&local_19,(double *)&local_48,pdVar3);
          }
        } while ((bool)in_stack_ffffffffffffff9f != false);
        in_stack_ffffffffffffff90 = local_48;
        pdVar3 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_38);
        *pdVar3 = (double)in_stack_ffffffffffffff90;
        dVar4 = __gnu_cxx::operator-(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        local_28 = dVar4 + local_28;
      }
      if (8 < local_28) {
        return false;
      }
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_30);
    }
  }
  return true;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }